

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesLedSetColor(zes_led_handle_t hLed,zes_led_color_t *pColor)

{
  zes_pfnLedSetColor_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnLedSetColor_t pfnSetColor;
  zes_led_color_t *pColor_local;
  zes_led_handle_t hLed_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Led).pfnSetColor;
    if (p_Var1 == (zes_pfnLedSetColor_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hLed_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hLed_local._4_4_ = (*p_Var1)(hLed,pColor);
    }
  }
  else {
    hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hLed_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesLedSetColor(
    zes_led_handle_t hLed,                          ///< [in] Handle for the component.
    const zes_led_color_t* pColor                   ///< [in] New color of the LED.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnLedSetColor_t pfnSetColor = [&result] {
        auto pfnSetColor = ze_lib::context->zesDdiTable.load()->Led.pfnSetColor;
        if( nullptr == pfnSetColor ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetColor;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetColor( hLed, pColor );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetColor = ze_lib::context->zesDdiTable.load()->Led.pfnSetColor;
    if( nullptr == pfnSetColor ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetColor( hLed, pColor );
    #endif
}